

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_gather.c
# Opt level: O0

REF_STATUS ref_gather_plt_qua_header(REF_GRID ref_grid,REF_INT id,FILE *file)

{
  REF_MPI pRVar1;
  uint uVar2;
  size_t sVar3;
  REF_LONG ref_private_status_reis_bi_15;
  REF_LONG ref_private_status_reis_ai_15;
  REF_LONG ref_private_status_reis_bi_14;
  REF_LONG ref_private_status_reis_ai_14;
  REF_LONG ref_private_status_reis_bi_13;
  REF_LONG ref_private_status_reis_ai_13;
  REF_LONG ref_private_status_reis_bi_12;
  REF_LONG ref_private_status_reis_ai_12;
  REF_LONG ref_private_status_reis_bi_11;
  REF_LONG ref_private_status_reis_ai_11;
  REF_LONG ref_private_status_reis_bi_10;
  REF_LONG ref_private_status_reis_ai_10;
  REF_LONG ref_private_status_reis_bi_9;
  REF_LONG ref_private_status_reis_ai_9;
  REF_LONG ref_private_status_reis_bi_8;
  REF_LONG ref_private_status_reis_ai_8;
  REF_LONG ref_private_status_reis_bi_7;
  REF_LONG ref_private_status_reis_ai_7;
  REF_LONG ref_private_status_reis_bi_6;
  REF_LONG ref_private_status_reis_ai_6;
  REF_LONG ref_private_status_reis_bi_5;
  REF_LONG ref_private_status_reis_ai_5;
  REF_LONG ref_private_status_reis_bi_4;
  REF_LONG ref_private_status_reis_ai_4;
  REF_LONG ref_private_status_reis_bi_3;
  REF_LONG ref_private_status_reis_ai_3;
  REF_LONG ref_private_status_reis_bi_2;
  REF_LONG ref_private_status_reis_ai_2;
  REF_LONG ref_private_status_reis_bi_1;
  REF_LONG ref_private_status_reis_ai_1;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_LONG ref_private_status_reis_bi;
  REF_LONG ref_private_status_reis_ai;
  undefined4 local_590;
  REF_STATUS ref_private_macro_code_rss;
  int aux;
  int celldim;
  REF_GLOB *l2c;
  REF_GLOB nnode;
  REF_LONG ncell;
  undefined4 local_568;
  int numelements;
  int numpts;
  int faceneighbors;
  int varloc;
  int datapacking;
  int zonetype;
  int notused;
  double solutiontime;
  int strandid;
  int parentzone;
  float zonemarker;
  int len;
  int ascii [256];
  char zonename [256];
  REF_CELL ref_cell;
  REF_MPI ref_mpi;
  FILE *file_local;
  REF_INT id_local;
  REF_GRID ref_grid_local;
  
  pRVar1 = ref_grid->mpi;
  strandid = 0x43958000;
  solutiontime._4_4_ = 0xffffffff;
  solutiontime._0_4_ = 0xffffffff;
  _zonetype = 0;
  datapacking = -1;
  faceneighbors = 0;
  numpts = 0;
  numelements = 0;
  ref_private_macro_code_rss = 0;
  local_590 = 0;
  varloc = 3;
  ref_grid_local._4_4_ =
       ref_grid_compact_cell_id_nodes
                 (ref_grid,ref_grid->cell[6],id,(REF_GLOB *)&l2c,&nnode,(REF_GLOB **)&aux);
  if (ref_grid_local._4_4_ == 0) {
    if (((long)l2c < 1) || (nnode < 1)) {
      if (_aux != (REF_GLOB *)0x0) {
        free(_aux);
      }
      ref_grid_local._4_4_ = 0;
    }
    else if ((long)l2c < 0x80000000) {
      local_568 = SUB84(l2c,0);
      if (nnode < 0x80000000) {
        ncell._4_4_ = (undefined4)nnode;
        if (pRVar1->id == 0) {
          sVar3 = fwrite(&strandid,4,1,(FILE *)file);
          if (sVar3 != 1) {
            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                   ,0xe8c,"ref_gather_plt_qua_header","zonemarker",1,sVar3);
            return 1;
          }
          snprintf((char *)(ascii + 0xfe),0x100,"qua%d",(ulong)(uint)id);
          uVar2 = ref_gather_plt_char_int
                            ((char *)(ascii + 0xfe),0x100,&parentzone,(REF_INT *)&zonemarker);
          if (uVar2 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                   ,0xe8f,"ref_gather_plt_qua_header",(ulong)uVar2,"a2i");
            return uVar2;
          }
          sVar3 = fwrite(&zonemarker,4,(long)parentzone,(FILE *)file);
          if ((long)parentzone != sVar3) {
            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                   ,0xe90,"ref_gather_plt_qua_header","title",(long)parentzone,sVar3);
            return 1;
          }
          sVar3 = fwrite((void *)((long)&solutiontime + 4),4,1,(FILE *)file);
          if (sVar3 != 1) {
            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                   ,0xe92,"ref_gather_plt_qua_header","int",1,sVar3);
            return 1;
          }
          sVar3 = fwrite(&solutiontime,4,1,(FILE *)file);
          if (sVar3 != 1) {
            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                   ,0xe93,"ref_gather_plt_qua_header","int",1,sVar3);
            return 1;
          }
          sVar3 = fwrite(&zonetype,8,1,(FILE *)file);
          if (sVar3 != 1) {
            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                   ,0xe94,"ref_gather_plt_qua_header","double",1,sVar3);
            return 1;
          }
          sVar3 = fwrite(&datapacking,4,1,(FILE *)file);
          if (sVar3 != 1) {
            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                   ,0xe95,"ref_gather_plt_qua_header","int",1,sVar3);
            return 1;
          }
          sVar3 = fwrite(&varloc,4,1,(FILE *)file);
          if (sVar3 != 1) {
            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                   ,0xe96,"ref_gather_plt_qua_header","int",1,sVar3);
            return 1;
          }
          sVar3 = fwrite(&faceneighbors,4,1,(FILE *)file);
          if (sVar3 != 1) {
            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                   ,0xe97,"ref_gather_plt_qua_header","int",1,sVar3);
            return 1;
          }
          sVar3 = fwrite(&numpts,4,1,(FILE *)file);
          if (sVar3 != 1) {
            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                   ,0xe98,"ref_gather_plt_qua_header","int",1,sVar3);
            return 1;
          }
          sVar3 = fwrite(&numelements,4,1,(FILE *)file);
          if (sVar3 != 1) {
            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                   ,0xe99,"ref_gather_plt_qua_header","int",1,sVar3);
            return 1;
          }
          sVar3 = fwrite(&local_568,4,1,(FILE *)file);
          if (sVar3 != 1) {
            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                   ,0xe9a,"ref_gather_plt_qua_header","int",1,sVar3);
            return 1;
          }
          sVar3 = fwrite((void *)((long)&ncell + 4),4,1,(FILE *)file);
          if (sVar3 != 1) {
            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                   ,0xe9b,"ref_gather_plt_qua_header","int",1,sVar3);
            return 1;
          }
          sVar3 = fwrite(&ref_private_macro_code_rss,4,1,(FILE *)file);
          if (sVar3 != 1) {
            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                   ,0xe9c,"ref_gather_plt_qua_header","int",1,sVar3);
            return 1;
          }
          sVar3 = fwrite(&ref_private_macro_code_rss,4,1,(FILE *)file);
          if (sVar3 != 1) {
            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                   ,0xe9d,"ref_gather_plt_qua_header","int",1,sVar3);
            return 1;
          }
          sVar3 = fwrite(&ref_private_macro_code_rss,4,1,(FILE *)file);
          if (sVar3 != 1) {
            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                   ,0xe9e,"ref_gather_plt_qua_header","int",1,sVar3);
            return 1;
          }
          sVar3 = fwrite(&local_590,4,1,(FILE *)file);
          if (sVar3 != 1) {
            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                   ,0xe9f,"ref_gather_plt_qua_header","int",1,sVar3);
            return 1;
          }
        }
        if (_aux != (REF_GLOB *)0x0) {
          free(_aux);
        }
        ref_grid_local._4_4_ = 0;
      }
      else {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
               0xe88,"ref_gather_plt_qua_header","too many qua for int");
        ref_grid_local._4_4_ = 1;
      }
    }
    else {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             0xe86,"ref_gather_plt_qua_header","too many nodes for int");
      ref_grid_local._4_4_ = 1;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",0xe80,
           "ref_gather_plt_qua_header",(ulong)ref_grid_local._4_4_,"l2c");
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN static REF_STATUS ref_gather_plt_qua_header(REF_GRID ref_grid,
                                                    REF_INT id, FILE *file) {
  REF_MPI ref_mpi = ref_grid_mpi(ref_grid);
  REF_CELL ref_cell = ref_grid_qua(ref_grid);
  char zonename[256];
  int ascii[256];
  int len;
  float zonemarker = 299.0;
  int parentzone = -1;
  int strandid = -1;
  double solutiontime = 0.0;
  int notused = -1;
  int zonetype;
  int datapacking = 0; /*0=Block, point does not work.*/
  int varloc = 0;      /*0 = Don't specify, all data is located at nodes*/
  int faceneighbors = 0;
  int numpts;
  int numelements;
  REF_LONG ncell;
  REF_GLOB nnode, *l2c;
  int celldim = 0;
  int aux = 0;

  zonetype = 3; /*3=FEQUADRILATERAL*/

  RSS(ref_grid_compact_cell_id_nodes(ref_grid, ref_cell, id, &nnode, &ncell,
                                     &l2c),
      "l2c");
  if (nnode <= 0 || ncell <= 0) {
    ref_free(l2c);
    return REF_SUCCESS;
  }

  RAS(nnode <= REF_INT_MAX, "too many nodes for int");
  numpts = (int)nnode;
  RAS(ncell <= REF_INT_MAX, "too many qua for int");
  numelements = (int)ncell;

  if (ref_mpi_once(ref_mpi)) {
    REIS(1, fwrite(&zonemarker, sizeof(float), 1, file), "zonemarker");

    snprintf(zonename, 256, "qua%d", id);
    RSS(ref_gather_plt_char_int(zonename, 256, &len, ascii), "a2i");
    REIS(len, fwrite(&ascii, sizeof(int), (unsigned long)len, file), "title");

    REIS(1, fwrite(&parentzone, sizeof(int), 1, file), "int");
    REIS(1, fwrite(&strandid, sizeof(int), 1, file), "int");
    REIS(1, fwrite(&solutiontime, sizeof(double), 1, file), "double");
    REIS(1, fwrite(&notused, sizeof(int), 1, file), "int");
    REIS(1, fwrite(&zonetype, sizeof(int), 1, file), "int");
    REIS(1, fwrite(&datapacking, sizeof(int), 1, file), "int");
    REIS(1, fwrite(&varloc, sizeof(int), 1, file), "int");
    REIS(1, fwrite(&faceneighbors, sizeof(int), 1, file), "int");
    REIS(1, fwrite(&numpts, sizeof(int), 1, file), "int");
    REIS(1, fwrite(&numelements, sizeof(int), 1, file), "int");
    REIS(1, fwrite(&celldim, sizeof(int), 1, file), "int");
    REIS(1, fwrite(&celldim, sizeof(int), 1, file), "int");
    REIS(1, fwrite(&celldim, sizeof(int), 1, file), "int");
    REIS(1, fwrite(&aux, sizeof(int), 1, file), "int");
  }

  ref_free(l2c);
  return REF_SUCCESS;
}